

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_write_rows(png_structrp png_ptr,png_bytepp row,png_uint_32 num_rows)

{
  png_bytepp local_28;
  png_bytepp rp;
  png_uint_32 i;
  png_uint_32 num_rows_local;
  png_bytepp row_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    local_28 = row;
    for (rp._0_4_ = 0; (uint)rp < num_rows; rp._0_4_ = (uint)rp + 1) {
      png_write_row(png_ptr,*local_28);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_write_rows(png_structrp png_ptr, png_bytepp row,
    png_uint_32 num_rows)
{
   png_uint_32 i; /* row counter */
   png_bytepp rp; /* row pointer */

   png_debug(1, "in png_write_rows");

   if (png_ptr == NULL)
      return;

   /* Loop through the rows */
   for (i = 0, rp = row; i < num_rows; i++, rp++)
   {
      png_write_row(png_ptr, *rp);
   }
}